

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RenameColumnInfo::Deserialize(RenameColumnInfo *this,Deserializer *deserializer)

{
  RenameColumnInfo *this_00;
  pointer pRVar1;
  _Head_base<0UL,_duckdb::RenameColumnInfo_*,_false> local_20;
  
  this_00 = (RenameColumnInfo *)operator_new(0xb8);
  RenameColumnInfo(this_00);
  local_20._M_head_impl = this_00;
  pRVar1 = unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"old_name",&pRVar1->old_name);
  pRVar1 = unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x191,"new_name",&pRVar1->new_name);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RenameColumnInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameColumnInfo>(new RenameColumnInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "old_name", result->old_name);
	deserializer.ReadPropertyWithDefault<string>(401, "new_name", result->new_name);
	return std::move(result);
}